

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

PsbtGlobalXpubStruct * __thiscall
cfd::api::json::PsbtGlobalXpub::ConvertToStruct
          (PsbtGlobalXpubStruct *__return_storage_ptr__,PsbtGlobalXpub *this)

{
  XpubDataStruct XStack_88;
  
  PsbtGlobalXpubStruct::PsbtGlobalXpubStruct(__return_storage_ptr__);
  XpubData::ConvertToStruct(&XStack_88,&this->xpub_);
  XpubDataStruct::operator=(&__return_storage_ptr__->xpub,&XStack_88);
  XpubDataStruct::~XpubDataStruct(&XStack_88);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->master_fingerprint);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->path);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->descriptor_xpub);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

PsbtGlobalXpubStruct PsbtGlobalXpub::ConvertToStruct() const {  // NOLINT
  PsbtGlobalXpubStruct result;
  result.xpub = xpub_.ConvertToStruct();
  result.master_fingerprint = master_fingerprint_;
  result.path = path_;
  result.descriptor_xpub = descriptor_xpub_;
  result.ignore_items = ignore_items;
  return result;
}